

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringconverter.cpp
# Opt level: O0

Interface * QStringConverterICU::make_icu_converter(State *state,char *name)

{
  UBool UVar1;
  char cVar2;
  UConverter *pUVar3;
  undefined8 uVar4;
  QMessageLogger *this;
  char *file;
  char *in_RSI;
  QFlags<QStringConverterBase::Flag> *in_RDI;
  long in_FS_OFFSET;
  qsizetype maxCharSize;
  char *persistentName;
  char *icuName;
  UConverter *conv;
  UErrorCode status;
  char *in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff90;
  int line;
  State *in_stack_ffffffffffffffb0;
  Interface *local_38;
  QMessageLogger local_30;
  UErrorCode local_c;
  long local_8;
  
  line = (int)((ulong)in_stack_ffffffffffffff90 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c = U_ZERO_ERROR;
  pUVar3 = createConverterForName(in_RSI,in_stack_ffffffffffffffb0);
  if (pUVar3 == (UConverter *)0x0) {
    local_38 = (Interface *)0x0;
  }
  else {
    uVar4 = ucnv_getName_70(pUVar3,&local_c);
    this = (QMessageLogger *)ucnv_getStandardName_70(uVar4,"MIME",&local_c);
    UVar1 = U_FAILURE(local_c);
    if ((UVar1 != '\0') || (this == (QMessageLogger *)0x0)) {
      local_c = U_ZERO_ERROR;
      this = (QMessageLogger *)ucnv_getStandardName_70(uVar4,"IANA",&local_c);
    }
    *(QMessageLogger **)(in_RDI + 8) = this;
    *(UConverter **)(in_RDI + 6) = pUVar3;
    QFlags<QStringConverterBase::Flag>::operator|=(in_RDI,UsesIcu);
    cVar2 = ucnv_getMaxCharSize_70(pUVar3);
    file = (char *)(long)cVar2;
    *(code **)(in_RDI + 10) = clear_function;
    if (((long)file < 9) && (0 < (long)file)) {
      local_38 = forLength + (long)(file + -1);
    }
    else {
      QMessageLogger::QMessageLogger(this,file,line,in_stack_ffffffffffffff88);
      QMessageLogger::warning
                (&local_30,"Encountered unexpected codec \"%s\" which requires >8x space",in_RSI);
      local_38 = (Interface *)0x0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_38;
  }
  __stack_chk_fail();
}

Assistant:

static const QStringConverter::Interface *make_icu_converter(
            QStringConverter::State *state,
            const char *name)
    {
        QT_COM_THREAD_INIT
        UErrorCode status = U_ZERO_ERROR;
        UConverter *conv = createConverterForName(name, state);
        if (!conv)
            return nullptr;

        const char *icuName = ucnv_getName(conv, &status);
        // ucnv_getStandardName returns a name which is owned by the library
        // we can thus store it in the state without worrying aobut its lifetime
        const char *persistentName = ucnv_getStandardName(icuName, "MIME", &status);
        if (U_FAILURE(status) || !persistentName) {
             status = U_ZERO_ERROR;
             persistentName = ucnv_getStandardName(icuName, "IANA", &status);
        }
        state->d[1] = const_cast<char *>(persistentName);
        state->d[0] = conv;
        state->flags |= QStringConverter::Flag::UsesIcu;
        qsizetype maxCharSize = ucnv_getMaxCharSize(conv);
        state->clearFn = QStringConverterICU::clear_function;
        if (maxCharSize > 8 || maxCharSize < 1) {
            qWarning("Encountered unexpected codec \"%s\" which requires >8x space", name);
            return nullptr;
        } else {
            return &forLength[maxCharSize - 1];
        }

    }